

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_is_leap.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  iVar1 = _PDCLIB_is_leap(1);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_is_leap.c, line %d - %s\n"
           ,0x1c,"! _PDCLIB_is_leap( 1 )");
  }
  iVar1 = _PDCLIB_is_leap(4);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_is_leap.c, line %d - %s\n"
           ,0x1e,"_PDCLIB_is_leap( 4 )");
  }
  iVar1 = _PDCLIB_is_leap(0);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_is_leap.c, line %d - %s\n"
           ,0x20,"! _PDCLIB_is_leap( 0 )");
  }
  iVar1 = _PDCLIB_is_leap(100);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_is_leap.c, line %d - %s\n"
           ,0x22,"_PDCLIB_is_leap( 100 )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    /* 1901 not leap */
    TESTCASE( ! _PDCLIB_is_leap( 1 ) );
    /* 1904 leap */
    TESTCASE( _PDCLIB_is_leap( 4 ) );
    /* 1900 not leap */
    TESTCASE( ! _PDCLIB_is_leap( 0 ) );
    /* 2000 leap */
    TESTCASE( _PDCLIB_is_leap( 100 ) );
#endif
    return TEST_RESULTS;
}